

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Matte.cpp
# Opt level: O1

RGBColor __thiscall pm::Matte::pathShade(Matte *this,ShadeRecord *sr)

{
  float fVar1;
  float fVar2;
  long in_RDX;
  float fVar3;
  float fVar4;
  float fVar5;
  float fVar6;
  float fVar7;
  RGBColor RVar8;
  Ray reflectedRay;
  float local_44;
  float local_40;
  float local_3c;
  undefined1 local_38 [8];
  float local_30;
  float local_2c;
  float local_28;
  float local_24;
  
  fVar4 = *(float *)(in_RDX + 0x28);
  fVar1 = *(float *)(in_RDX + 0x2c);
  fVar2 = *(float *)(in_RDX + 0x30);
  fVar7 = fVar2 - fVar1 * 0.0071;
  fVar6 = fVar4 * 0.0071 + fVar2 * -0.0034;
  fVar5 = fVar1 * 0.0034 - fVar4;
  fVar3 = fVar5 * fVar5 + fVar7 * fVar7 + fVar6 * fVar6;
  if (fVar3 < 0.0) {
    fVar3 = sqrtf(fVar3);
  }
  else {
    fVar3 = SQRT(fVar3);
  }
  fVar7 = fVar7 / fVar3;
  fVar6 = fVar6 / fVar3;
  fVar5 = fVar5 / fVar3;
  SamplerState::sampleHemisphere((SamplerState *)local_38);
  local_2c = fVar4 * local_30 +
             fVar7 * (float)local_38._4_4_ + (fVar6 * fVar2 - fVar1 * fVar5) * (float)local_38._0_4_
  ;
  local_28 = fVar1 * local_30 +
             fVar6 * (float)local_38._4_4_ + (fVar5 * fVar4 - fVar2 * fVar7) * (float)local_38._0_4_
  ;
  local_24 = fVar2 * local_30 +
             fVar5 * (float)local_38._4_4_ + (fVar7 * fVar1 - fVar4 * fVar6) * (float)local_38._0_4_
  ;
  fVar4 = local_24 * local_24 + local_2c * local_2c + local_28 * local_28;
  if (fVar4 < 0.0) {
    fVar4 = sqrtf(fVar4);
  }
  else {
    fVar4 = SQRT(fVar4);
  }
  local_2c = local_2c / fVar4;
  local_28 = local_28 / fVar4;
  local_24 = local_24 / fVar4;
  fVar5 = *(float *)(in_RDX + 0x28) * local_2c;
  fVar6 = (*(float *)(in_RDX + 0x30) * local_24 + *(float *)(in_RDX + 0x2c) * local_28 + fVar5) *
          0.31830987;
  fVar4 = *(float *)&sr->world;
  fVar1 = *(float *)((long)&sr->world + 4);
  fVar2 = *(float *)&sr->tracer;
  fVar3 = *(float *)((long)&sr->tracer + 4);
  fVar5 = *(float *)(in_RDX + 0x30) * local_24 + *(float *)(in_RDX + 0x2c) * local_28 + fVar5;
  local_38._0_4_ = *(undefined4 *)(in_RDX + 0x10);
  local_38._4_4_ = *(undefined4 *)(in_RDX + 0x14);
  local_30 = *(float *)(in_RDX + 0x18);
  (**(code **)(**(long **)(in_RDX + 0x68) + 0x18))
            (&local_44,*(long **)(in_RDX + 0x68),*(undefined8 *)(in_RDX + 0x60),local_38,
             *(int *)(in_RDX + 0x4c) + 1);
  RVar8.g = 0.0;
  RVar8.r = fVar6;
  RVar8.b = (fVar1 * fVar4 * 0.31830987 * local_44 * fVar5) / fVar6;
  *(float *)&(this->super_Material)._vptr_Material = RVar8.b;
  *(float *)((long)&(this->super_Material)._vptr_Material + 4) =
       (fVar2 * fVar4 * 0.31830987 * local_40 * fVar5) / fVar6;
  (this->super_Material).type_ = (Type)((fVar4 * fVar3 * 0.31830987 * local_3c * fVar5) / fVar6);
  return RVar8;
}

Assistant:

RGBColor Matte::pathShade(ShadeRecord &sr) const
{
	Vector3 wi;
	const Vector3 wo = -sr.ray.d;
	float pdf = 0.0f;
	const RGBColor f = diffuseBrdf_.sampleF(sr, wo, wi, pdf);
	const float nDotWi = dot(sr.normal, wi);
	const Ray reflectedRay(sr.hitPoint, wi);

	return (f * sr.tracer.traceRay(sr.world, reflectedRay, sr.depth + 1) * nDotWi / pdf);
}